

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

void __thiscall leveldb::Block::Iter::Prev(Iter *this)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  Iter *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  uint32_t original;
  uint32_t index;
  undefined4 in_stack_ffffffffffffffe8;
  Iter *this_00;
  Iter *this_01;
  
  this_01 = *(Iter **)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar2 = (*(in_RDI->super_Iterator)._vptr_Iterator[2])();
  if ((uVar2 & 1) == 0) {
    __assert_fail("Valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/block.cc"
                  ,0x90,"virtual void leveldb::Block::Iter::Prev()");
  }
  uVar2 = in_RDI->current_;
  do {
    index = (uint32_t)((ulong)in_RDI >> 0x20);
    uVar3 = GetRestartPoint((Iter *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),index);
    if (uVar3 < uVar2) {
      SeekToRestartPoint((Iter *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),index);
      do {
        bVar1 = ParseNextKey(this_00);
        bVar4 = false;
        if (bVar1) {
          uVar3 = NextEntryOffset(this_01);
          bVar4 = uVar3 < uVar2;
        }
      } while (bVar4);
LAB_018dcbd4:
      if (*(Iter **)(in_FS_OFFSET + 0x28) != this_01) {
        __stack_chk_fail();
      }
      return;
    }
    if (in_RDI->restart_index_ == 0) {
      in_RDI->current_ = in_RDI->restarts_;
      in_RDI->restart_index_ = in_RDI->num_restarts_;
      goto LAB_018dcbd4;
    }
    in_RDI->restart_index_ = in_RDI->restart_index_ - 1;
  } while( true );
}

Assistant:

void Prev() override {
    assert(Valid());

    // Scan backwards to a restart point before current_
    const uint32_t original = current_;
    while (GetRestartPoint(restart_index_) >= original) {
      if (restart_index_ == 0) {
        // No more entries
        current_ = restarts_;
        restart_index_ = num_restarts_;
        return;
      }
      restart_index_--;
    }

    SeekToRestartPoint(restart_index_);
    do {
      // Loop until end of current entry hits the start of original entry
    } while (ParseNextKey() && NextEntryOffset() < original);
  }